

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::BoxStackInstance
              (Var instance,ScriptContext *scriptContext,bool allowStackFunction,bool deepCopy)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *this;
  JavascriptNativeIntArray *pJVar5;
  JavascriptArray *pJVar6;
  DynamicObject *pDVar7;
  JavascriptRegExp *pJVar8;
  JavascriptNativeFloatArray *pJVar9;
  char *message;
  char *error;
  uint lineNumber;
  Type TVar10;
  
  bVar2 = ThreadContext::IsOnStack(instance);
  if (!bVar2) {
    return instance;
  }
  if (((allowStackFunction) && (bVar2 = VarIs<Js::RecyclableObject>(instance), bVar2)) &&
     ((*instance & 1) != 0)) {
    return instance;
  }
  if (instance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00accb80;
    *puVar4 = 0;
  }
  if (((ulong)instance & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)instance & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00accb80;
    *puVar4 = 0;
  }
  TVar10 = TypeIds_FirstNumberType;
  if ((((ulong)instance & 0xffff000000000000) != 0x1000000000000) &&
     (TVar10 = TypeIds_Number, (ulong)instance >> 0x32 == 0)) {
    this = UnsafeVarTo<Js::RecyclableObject>(instance);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00accb80;
      *puVar4 = 0;
    }
    TVar10 = ((this->type).ptr)->typeId;
    if ((0x57 < (int)TVar10) && (BVar3 = RecyclableObject::IsExternal(this), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) goto LAB_00accb80;
      *puVar4 = 0;
    }
  }
  switch(TVar10) {
  case TypeIds_Function:
    if (allowStackFunction) {
      return instance;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    error = "(allowStackFunction)";
    message = "allowStackFunction";
    lineNumber = 0x289f;
    goto LAB_00accb5e;
  case TypeIds_Object:
    pDVar7 = VarTo<Js::DynamicObject>(instance);
    pDVar7 = DynamicObject::BoxStackInstance(pDVar7,deepCopy);
    return pDVar7;
  case TypeIds_Array:
    pJVar6 = UnsafeVarTo<Js::JavascriptArray>(instance);
    pJVar6 = JavascriptArray::BoxStackInstance(pJVar6,deepCopy);
    return pJVar6;
  case TypeIds_NativeIntArray:
    pJVar5 = UnsafeVarTo<Js::JavascriptNativeIntArray>(instance);
    pJVar5 = JavascriptNativeIntArray::BoxStackInstance(pJVar5,deepCopy);
    return pJVar5;
  case TypeIds_CopyOnAccessNativeIntArray:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x28a5,"(false)","false");
    if (!bVar2) goto LAB_00accb80;
    *puVar4 = 0;
    break;
  case TypeIds_ArrayLast:
    pJVar9 = UnsafeVarTo<Js::JavascriptNativeFloatArray>(instance);
    pJVar9 = JavascriptNativeFloatArray::BoxStackInstance(pJVar9,deepCopy);
    return pJVar9;
  case TypeIds_ArrayLastWithES5:
  case TypeIds_Date:
    break;
  case TypeIds_RegEx:
    pJVar8 = VarTo<Js::JavascriptRegExp>(instance);
    pJVar8 = JavascriptRegExp::BoxStackInstance(pJVar8,deepCopy);
    return pJVar8;
  default:
    if (TVar10 - TypeIds_FirstNumberType < 2) {
      return instance;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  error = "(false)";
  message = "false";
  lineNumber = 0x28a9;
LAB_00accb5e:
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                              ,lineNumber,error,message);
  if (bVar2) {
    *puVar4 = 0;
    return instance;
  }
LAB_00accb80:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Js::Var
    JavascriptOperators::BoxStackInstance(Js::Var instance, ScriptContext * scriptContext, bool allowStackFunction, bool deepCopy)
    {
        if (!ThreadContext::IsOnStack(instance) || (allowStackFunction && !TaggedNumber::Is(instance) && (*(int*)instance & 1)))
        {
            return instance;
        }

        TypeId typeId = JavascriptOperators::GetTypeId(instance);
        switch (typeId)
        {
        case Js::TypeIds_Number:
#if !FLOATVAR
            return JavascriptNumber::BoxStackInstance(instance, scriptContext);
#endif
            // fall-through
        case Js::TypeIds_Integer:
            return instance;
        case Js::TypeIds_RegEx:
            return JavascriptRegExp::BoxStackInstance(VarTo<JavascriptRegExp>(instance), deepCopy);
        case Js::TypeIds_Object:
            return DynamicObject::BoxStackInstance(VarTo<DynamicObject>(instance), deepCopy);
        case Js::TypeIds_Array:
            return JavascriptArray::BoxStackInstance(UnsafeVarTo<JavascriptArray>(instance), deepCopy);
        case Js::TypeIds_NativeIntArray:
            return JavascriptNativeIntArray::BoxStackInstance(UnsafeVarTo<JavascriptNativeIntArray>(instance), deepCopy);
        case Js::TypeIds_NativeFloatArray:
            return JavascriptNativeFloatArray::BoxStackInstance(UnsafeVarTo<JavascriptNativeFloatArray>(instance), deepCopy);
        case Js::TypeIds_Function:
            Assert(allowStackFunction);
            // Stack functions are deal with not mar mark them, but by nested function escape analysis
            // in the front end.  No need to box here.
            return instance;
#if ENABLE_COPYONACCESS_ARRAY
        case Js::TypeIds_CopyOnAccessNativeIntArray:
            Assert(false);
            // fall-through
#endif
        default:
            Assert(false);
            return instance;
        };
    }